

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gflags.cc
# Opt level: O3

bool gflags::anon_unknown_2::AddFlagValidator(void *flag_ptr,ValidateFnProto validate_fn_proto)

{
  Mutex *pMVar1;
  int iVar2;
  bool bVar3;
  FlagRegistry *pFVar4;
  _Base_ptr p_Var5;
  size_t sVar6;
  ostream *poVar7;
  _Base_ptr p_Var8;
  _Rb_tree_header *p_Var9;
  long lVar10;
  char *pcVar11;
  
  pFVar4 = FlagRegistry::GlobalRegistry();
  pMVar1 = &pFVar4->lock_;
  iVar2 = pMVar1->mutex_;
  pMVar1->mutex_ = pMVar1->mutex_ + -1;
  if (iVar2 != 0) {
    __assert_fail("--mutex_ == -1",
                  "/workspace/llm4binary/github/license_c_cmakelists/jarulraj[P]sqlcheck/external/gflags/src/mutex.h"
                  ,0xde,"void gflags_mutex_namespace::Mutex::Lock()");
  }
  p_Var8 = (pFVar4->flags_by_ptr_)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  if (p_Var8 == (_Base_ptr)0x0) {
LAB_001305dc:
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"Ignoring RegisterValidateFunction() for flag pointer ",0x35);
    poVar7 = std::ostream::_M_insert<void_const*>(&std::cerr);
    lVar10 = 0x1f;
    pcVar11 = ": no flag found at that address";
  }
  else {
    p_Var9 = &(pFVar4->flags_by_ptr_)._M_t._M_impl.super__Rb_tree_header;
    p_Var5 = &p_Var9->_M_header;
    do {
      if (*(void **)(p_Var8 + 1) >= flag_ptr) {
        p_Var5 = p_Var8;
      }
      p_Var8 = (&p_Var8->_M_left)[*(void **)(p_Var8 + 1) < flag_ptr];
    } while (p_Var8 != (_Base_ptr)0x0);
    if ((((_Rb_tree_header *)p_Var5 == p_Var9) || (flag_ptr < *(void **)(p_Var5 + 1))) ||
       (p_Var8 = p_Var5[1]._M_parent, p_Var8 == (_Base_ptr)0x0)) goto LAB_001305dc;
    bVar3 = true;
    if (p_Var8[1]._M_left == (_Base_ptr)validate_fn_proto) goto LAB_0013061c;
    if ((validate_fn_proto == (ValidateFnProto)0x0) || (p_Var8[1]._M_left == (_Base_ptr)0x0)) {
      p_Var8[1]._M_left = (_Base_ptr)validate_fn_proto;
      goto LAB_0013061c;
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"Ignoring RegisterValidateFunction() for flag \'",0x2e);
    pcVar11 = *(char **)p_Var8;
    if (pcVar11 == (char *)0x0) {
      std::ios::clear((int)*(undefined8 *)(std::cerr + -0x18) + 0x150450);
    }
    else {
      sVar6 = strlen(pcVar11);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,pcVar11,sVar6);
    }
    poVar7 = (ostream *)&std::cerr;
    lVar10 = 0x21;
    pcVar11 = "\': validate-fn already registered";
  }
  std::__ostream_insert<char,std::char_traits<char>>(poVar7,pcVar11,lVar10);
  bVar3 = false;
LAB_0013061c:
  pMVar1 = &pFVar4->lock_;
  pMVar1->mutex_ = pMVar1->mutex_ + 1;
  if (pMVar1->mutex_ == 0) {
    return bVar3;
  }
  __assert_fail("mutex_++ == -1",
                "/workspace/llm4binary/github/license_c_cmakelists/jarulraj[P]sqlcheck/external/gflags/src/mutex.h"
                ,0xdf,"void gflags_mutex_namespace::Mutex::Unlock()");
}

Assistant:

bool AddFlagValidator(const void* flag_ptr, ValidateFnProto validate_fn_proto) {
  // We want a lock around this routine, in case two threads try to
  // add a validator (hopefully the same one!) at once.  We could use
  // our own thread, but we need to loook at the registry anyway, so
  // we just steal that one.
  FlagRegistry* const registry = FlagRegistry::GlobalRegistry();
  FlagRegistryLock frl(registry);
  // First, find the flag whose current-flag storage is 'flag'.
  // This is the CommandLineFlag whose current_->value_buffer_ == flag
  CommandLineFlag* flag = registry->FindFlagViaPtrLocked(flag_ptr);
  if (!flag) {
    LOG(WARNING) << "Ignoring RegisterValidateFunction() for flag pointer "
                 << flag_ptr << ": no flag found at that address";
    return false;
  } else if (validate_fn_proto == flag->validate_function()) {
    return true;    // ok to register the same function over and over again
  } else if (validate_fn_proto != NULL && flag->validate_function() != NULL) {
    LOG(WARNING) << "Ignoring RegisterValidateFunction() for flag '"
                 << flag->name() << "': validate-fn already registered";
    return false;
  } else {
    flag->validate_fn_proto_ = validate_fn_proto;
    return true;
  }
}